

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::match(Parser *this,int t)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined8 uVar4;
  int in_ESI;
  long *in_RDI;
  bool in_stack_0000006b;
  int in_stack_0000006c;
  RefToken *in_stack_00000070;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000078;
  MismatchedTokenException *in_stack_00000080;
  undefined1 local_18 [12];
  int local_c;
  
  local_c = in_ESI;
  if (DEBUG_PARSER) {
    poVar2 = std::operator<<((ostream *)&std::cout,"enter match(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c);
    poVar2 = std::operator<<(poVar2,") with LA(1)=");
    iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  }
  iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar1 != local_c) {
    if ((DEBUG_PARSER & 1U) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"token mismatch: ");
      iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      poVar2 = std::operator<<(poVar2,"!=");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,local_c);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    uVar4 = __cxa_allocate_exception(0xb0);
    (**(code **)(*in_RDI + 0x28))(local_18,in_RDI,1);
    MismatchedTokenException::MismatchedTokenException
              (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_0000006c,
               in_stack_0000006b);
    __cxa_throw(uVar4,&MismatchedTokenException::typeinfo,
                MismatchedTokenException::~MismatchedTokenException);
  }
  (**(code **)(*in_RDI + 0x10))();
  return;
}

Assistant:

void Parser::match(int t)
{
	if ( DEBUG_PARSER )
		std::cout << "enter match(" << t << ") with LA(1)=" << LA(1) << std::endl;
	if ( LA(1)!=t ) {
		if ( DEBUG_PARSER )
			std::cout << "token mismatch: " << LA(1) << "!=" << t << std::endl;
		throw MismatchedTokenException(tokenNames, LT(1), t, false);
	} else {
		// mark token as consumed -- fetch next token deferred until LA/LT
		consume();
	}
}